

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

void icu_63::IslamicCalendar::initializeSystemDefaultCentury(void)

{
  UBool UVar1;
  UDate date;
  Locale local_358;
  undefined1 local_278 [8];
  IslamicCalendar calendar;
  UErrorCode status;
  
  calendar.super_Calendar._612_4_ = 0;
  Locale::Locale(&local_358,"@calendar=islamic-civil",(char *)0x0,(char *)0x0,(char *)0x0);
  IslamicCalendar((IslamicCalendar *)local_278,&local_358,
                  (UErrorCode *)&calendar.super_Calendar.field_0x264,CIVIL);
  Locale::~Locale(&local_358);
  UVar1 = ::U_SUCCESS(calendar.super_Calendar._612_4_);
  if (UVar1 != '\0') {
    date = Calendar::getNow();
    Calendar::setTime((Calendar *)local_278,date,(UErrorCode *)&calendar.super_Calendar.field_0x264)
    ;
    Calendar::add((Calendar *)local_278,UCAL_YEAR,-0x50,
                  (UErrorCode *)&calendar.super_Calendar.field_0x264);
    gSystemDefaultCenturyStart =
         Calendar::getTime((Calendar *)local_278,(UErrorCode *)&calendar.super_Calendar.field_0x264)
    ;
    gSystemDefaultCenturyStartYear =
         Calendar::get((Calendar *)local_278,UCAL_YEAR,
                       (UErrorCode *)&calendar.super_Calendar.field_0x264);
  }
  ~IslamicCalendar((IslamicCalendar *)local_278);
  return;
}

Assistant:

U_CFUNC void U_CALLCONV
IslamicCalendar::initializeSystemDefaultCentury()
{
    // initialize systemDefaultCentury and systemDefaultCenturyYear based
    // on the current time.  They'll be set to 80 years before
    // the current time.
    UErrorCode status = U_ZERO_ERROR;
    IslamicCalendar calendar(Locale("@calendar=islamic-civil"),status);
    if (U_SUCCESS(status)) {
        calendar.setTime(Calendar::getNow(), status);
        calendar.add(UCAL_YEAR, -80, status);

        gSystemDefaultCenturyStart = calendar.getTime(status);
        gSystemDefaultCenturyStartYear = calendar.get(UCAL_YEAR, status);
    }
    // We have no recourse upon failure unless we want to propagate the failure
    // out.
}